

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode UA_Client_Subscriptions_manuallySendPublishRequest(UA_Client *client)

{
  ListOfUnacknowledgedNotifications *pLVar1;
  int iVar2;
  UA_Client_NotificationsAckNumber *pUVar3;
  UA_Client_NotificationsAckNumber **ppUVar4;
  ulong *puVar5;
  UA_ExtensionObject *pUVar6;
  UA_UInt32 *pUVar7;
  UA_Client_MonitoredItem *pUVar8;
  UA_Client_NotificationsAckNumber *pUVar9;
  long lVar10;
  byte bVar11;
  size_t k;
  UA_ExtensionObject *pUVar12;
  ulong uVar13;
  UA_DiagnosticInfo **ppUVar14;
  size_t __size;
  undefined8 *puVar15;
  UA_StatusCode UVar16;
  size_t j;
  ulong uVar17;
  UA_Client_Subscription *pUVar18;
  byte bVar19;
  undefined8 local_230 [16];
  undefined1 local_1b0 [8];
  UA_PublishResponse response;
  void *pvStack_50;
  
  bVar19 = 0;
  UVar16 = 0x800d0000;
  if (client->state != UA_CLIENTSTATE_ERRORED) {
    pLVar1 = &client->pendingNotificationsAcks;
    bVar11 = 1;
    while( true ) {
      UVar16 = 0;
      if ((bVar11 & 1) == 0) break;
      pvStack_50 = (void *)0x0;
      response.diagnosticInfos = (UA_DiagnosticInfo *)0x0;
      __size = 0xfffffffffffffff8;
      pUVar6 = (UA_ExtensionObject *)0xffffffffffffffff;
      pUVar9 = (UA_Client_NotificationsAckNumber *)pLVar1;
      do {
        pUVar9 = (pUVar9->listEntry).le_next;
        pUVar6 = (UA_ExtensionObject *)((long)&pUVar6->encoding + 1);
        __size = __size + 8;
      } while (pUVar9 != (UA_Client_NotificationsAckNumber *)0x0);
      if ((pUVar6 != (UA_ExtensionObject *)0x0) &&
         (pvStack_50 = malloc(__size), pvStack_50 == (void *)0x0)) {
        return 0;
      }
      pUVar7 = (UA_UInt32 *)((long)pvStack_50 + 4);
      pUVar9 = (UA_Client_NotificationsAckNumber *)pLVar1;
      while (pUVar9 = (pUVar9->listEntry).le_next, pUVar9 != (UA_Client_NotificationsAckNumber *)0x0
            ) {
        *pUVar7 = (pUVar9->subAck).sequenceNumber;
        pUVar7[-1] = (pUVar9->subAck).subscriptionId;
        pUVar7 = pUVar7 + 2;
      }
      ppUVar14 = &response.diagnosticInfos;
      puVar15 = local_230;
      for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar15 = *ppUVar14;
        ppUVar14 = ppUVar14 + (ulong)bVar19 * -2 + 1;
        puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
      }
      __UA_Client_Service(client,local_230,UA_TYPES + 0x6f,local_1b0,UA_TYPES + 0x4e);
      pUVar18 = (UA_Client_Subscription *)&client->subscriptions;
      if (response.responseHeader.timestamp._4_4_ == 0) {
        do {
          pUVar18 = (pUVar18->listEntry).le_next;
          if (pUVar18 == (UA_Client_Subscription *)0x0) goto LAB_00124d55;
        } while (pUVar18->subscriptionID != response.responseHeader.additionalHeader.content._32_4_)
        ;
        for (pUVar12 = (UA_ExtensionObject *)0x0;
            (pUVar12 < response.notificationMessage.notificationData && (pUVar12 < pUVar6));
            pUVar12 = (UA_ExtensionObject *)((long)&pUVar12->encoding + 1)) {
          iVar2 = *(int *)(response.resultsSize + (long)pUVar12 * 4);
          pUVar9 = (UA_Client_NotificationsAckNumber *)pLVar1;
          if ((iVar2 == 0) || (iVar2 == -0x7f860000)) {
            do {
              pUVar9 = (pUVar9->listEntry).le_next;
              if (pUVar9 == (UA_Client_NotificationsAckNumber *)0x0) goto LAB_00124e10;
            } while (((pUVar9->subAck).subscriptionId !=
                      *(UA_UInt32 *)((long)pvStack_50 + (long)pUVar12 * 8)) ||
                    ((pUVar9->subAck).sequenceNumber !=
                     *(UA_UInt32 *)((long)pvStack_50 + (long)pUVar12 * 8 + 4)));
            pUVar3 = (pUVar9->listEntry).le_next;
            ppUVar4 = (pUVar9->listEntry).le_prev;
            if (pUVar3 != (UA_Client_NotificationsAckNumber *)0x0) {
              (pUVar3->listEntry).le_prev = ppUVar4;
            }
            *ppUVar4 = pUVar3;
            free(pUVar9);
            if (pUVar9 == pLVar1->lh_first) {
              __assert_fail("ack != ((&client->pendingNotificationsAcks)->lh_first)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                            ,0x671e,
                            "void UA_Client_processPublishResponse(UA_Client *, UA_PublishRequest *, UA_PublishResponse *)"
                           );
            }
          }
LAB_00124e10:
        }
        for (uVar13 = 0; uVar13 < (ulong)response.notificationMessage.publishTime;
            uVar13 = uVar13 + 1) {
          if ((*(int *)(response.notificationMessage.notificationDataSize + uVar13 * 0x30) == 3) &&
             (lVar10 = response.notificationMessage.notificationDataSize + uVar13 * 0x30,
             *(long *)(lVar10 + 8) == 0x13c8c0)) {
            puVar5 = *(ulong **)(lVar10 + 0x10);
            for (uVar17 = 0; uVar17 < *puVar5; uVar17 = uVar17 + 1) {
              pUVar7 = (UA_UInt32 *)(uVar17 * 0x68 + puVar5[1]);
              pUVar8 = (UA_Client_MonitoredItem *)&pUVar18->monitoredItems;
              do {
                pUVar8 = (pUVar8->listEntry).le_next;
                if (pUVar8 == (UA_Client_MonitoredItem *)0x0) goto LAB_00124e7e;
              } while (pUVar8->clientHandle != *pUVar7);
              (*pUVar8->handler)(pUVar8->monitoredItemId,(UA_DataValue *)(pUVar7 + 2),
                                 pUVar8->handlerContext);
LAB_00124e7e:
            }
          }
        }
        pUVar9 = (UA_Client_NotificationsAckNumber *)malloc(0x18);
        if (pUVar9 == (UA_Client_NotificationsAckNumber *)0x0) {
          UA_LOG_WARNING((client->config).logger,UA_LOGCATEGORY_CLIENT,
                         "Not enough memory to store the acknowledgement for a publish message on subscription %u"
                         ,(ulong)pUVar18->subscriptionID);
        }
        else {
          (pUVar9->subAck).sequenceNumber = response._160_4_;
          (pUVar9->subAck).subscriptionId = pUVar18->subscriptionID;
          pUVar3 = pLVar1->lh_first;
          (pUVar9->listEntry).le_next = pUVar3;
          if (pUVar3 != (UA_Client_NotificationsAckNumber *)0x0) {
            (pUVar3->listEntry).le_prev = (UA_Client_NotificationsAckNumber **)pUVar9;
          }
          pLVar1->lh_first = pUVar9;
          (pUVar9->listEntry).le_prev = &pLVar1->lh_first;
        }
      }
LAB_00124d55:
      bVar11 = (byte)response.availableSequenceNumbers;
      UA_PublishResponse_deleteMembers((UA_PublishResponse *)local_1b0);
      UA_deleteMembers(&response.diagnosticInfos,UA_TYPES + 0x6f);
    }
  }
  return UVar16;
}

Assistant:

UA_StatusCode
UA_Client_Subscriptions_manuallySendPublishRequest(UA_Client *client) {
    if (client->state == UA_CLIENTSTATE_ERRORED)
        return UA_STATUSCODE_BADSERVERNOTCONNECTED;

    UA_Boolean moreNotifications = true;
    while(moreNotifications) {
        UA_PublishRequest request;
        UA_PublishRequest_init(&request);
        request.subscriptionAcknowledgementsSize = 0;

        UA_Client_NotificationsAckNumber *ack;
        LIST_FOREACH(ack, &client->pendingNotificationsAcks, listEntry)
            ++request.subscriptionAcknowledgementsSize;
        if(request.subscriptionAcknowledgementsSize > 0) {
            request.subscriptionAcknowledgements =
                UA_malloc(sizeof(UA_SubscriptionAcknowledgement) * request.subscriptionAcknowledgementsSize);
            if(!request.subscriptionAcknowledgements)
                return UA_STATUSCODE_GOOD;
        }

        int i = 0;
        LIST_FOREACH(ack, &client->pendingNotificationsAcks, listEntry) {
            request.subscriptionAcknowledgements[i].sequenceNumber = ack->subAck.sequenceNumber;
            request.subscriptionAcknowledgements[i].subscriptionId = ack->subAck.subscriptionId;
            ++i;
        }

        UA_PublishResponse response = UA_Client_Service_publish(client, request);
        UA_Client_processPublishResponse(client, &request, &response);
        moreNotifications = response.moreNotifications;

        UA_PublishResponse_deleteMembers(&response);
        UA_PublishRequest_deleteMembers(&request);
    }
    return UA_STATUSCODE_GOOD;
}